

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_impl<toml::type_config>
            (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *__return_storage_ptr__,vector<unsigned_char,_std::allocator<unsigned_char>_> *cs,
            string *fname,spec *s)

{
  uchar uVar1;
  pointer puVar2;
  char_type_conflict cVar3;
  char_type_conflict cVar4;
  char_type_conflict cVar5;
  basic_value<toml::type_config> *v;
  location *this;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> src;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  source_ptr local_308;
  source_ptr local_2f8;
  context<toml::type_config> ctx;
  location loc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1d8;
  region local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_value<toml::type_config> local_f8;
  
  puVar2 = (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start == puVar2) {
    std::
    make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&src);
    local_2f8.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = src.
              super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_2f8.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         src.
         super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    src.
    super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    src.
    super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string
              (&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fname
              );
    location::location((location *)&ctx,&local_2f8,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2f8.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    local_1d8._M_buckets = &local_1d8._M_single_bucket;
    local_1d8._M_bucket_count = 1;
    local_1d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1d8._M_element_count = 0;
    local_1d8._M_rehash_policy._M_max_load_factor = 1.0;
    local_1d8._M_rehash_policy._4_4_ = 0;
    local_1d8._M_rehash_policy._M_next_resize = 0;
    local_1d8._M_single_bucket = (__node_base_ptr)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_1a0,(location *)&ctx);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)&loc,(table_type *)&local_1d8,
               (table_format_info)ZEXT816(0),&local_328,&local_1a0);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_f8,(toml *)&loc,v);
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::result(__return_storage_ptr__,(success_type *)&local_f8);
    basic_value<toml::type_config>::~basic_value(&local_f8);
    basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&loc);
    region::~region(&local_1a0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_328);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1d8);
    this = (location *)&ctx;
  }
  else {
    uVar1 = puVar2[-1];
    if ((uVar1 != '\n') && (uVar1 != '\r')) {
      loc.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_1_ = 10;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)cs,(uchar *)&loc);
    }
    std::
    make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&src);
    local_308.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = src.
              super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_308.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         src.
         super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    src.
    super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    src.
    super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string
              (&local_138,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fname
              );
    location::location(&loc,&local_308,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_308.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (2 < (ulong)(((long *)CONCAT71(loc.source_.
                                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._1_7_,
                                      loc.source_.
                                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._0_1_))[1] -
                   *(long *)CONCAT71(loc.source_.
                                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     loc.source_.
                                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_1_))) {
      location::location((location *)&ctx,&loc);
      cVar3 = location::current(&loc);
      location::advance(&loc,1);
      cVar4 = location::current(&loc);
      location::advance(&loc,1);
      cVar5 = location::current(&loc);
      location::advance(&loc,1);
      if (((cVar3 != 0xef) || (cVar4 != 0xbb)) || (cVar5 != 0xbf)) {
        location::operator=(&loc,(location *)&ctx);
      }
      location::~location((location *)&ctx);
    }
    ctx.toml_spec_.v1_1_0_add_escape_sequence_e = s->v1_1_0_add_escape_sequence_e;
    ctx.toml_spec_.v1_1_0_add_escape_sequence_x = s->v1_1_0_add_escape_sequence_x;
    ctx.toml_spec_.v1_1_0_make_seconds_optional = s->v1_1_0_make_seconds_optional;
    ctx.toml_spec_.ext_hex_float = s->ext_hex_float;
    ctx.toml_spec_.ext_num_suffix = s->ext_num_suffix;
    ctx.toml_spec_.ext_null_value = s->ext_null_value;
    ctx.toml_spec_._22_2_ = *(undefined2 *)&s->field_0x16;
    ctx.toml_spec_.version.major = (s->version).major;
    ctx.toml_spec_.version.minor = (s->version).minor;
    ctx.toml_spec_._8_8_ = *(undefined8 *)&(s->version).patch;
    ctx.errors_.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ctx.errors_.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ctx.errors_.super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parse_file<toml::type_config>(__return_storage_ptr__,&loc,&ctx);
    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector(&ctx.errors_);
    this = &loc;
  }
  location::~location(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &src.
              super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_impl(std::vector<location::char_type> cs, std::string fname, const spec& s)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    // an empty file is a valid toml file.
    if(cs.empty())
    {
        auto src = std::make_shared<std::vector<location::char_type>>(std::move(cs));
        location loc(std::move(src), std::move(fname));
        return ok(value_type(table_type(), table_format_info{}, std::vector<std::string>{}, region(loc)));
    }

    // to simplify parser, add newline at the end if there is no LF.
    // But, if it has raw CR, the file is invalid (in TOML, CR is not a valid
    // newline char). if it ends with CR, do not add LF and report it.
    if(cs.back() != '\n' && cs.back() != '\r')
    {
        cs.push_back('\n');
    }

    auto src = std::make_shared<std::vector<location::char_type>>(std::move(cs));

    location loc(std::move(src), std::move(fname));

    // skip BOM if found
    if(loc.source()->size() >= 3)
    {
        auto first = loc;

        const auto c0 = loc.current(); loc.advance();
        const auto c1 = loc.current(); loc.advance();
        const auto c2 = loc.current(); loc.advance();

        const auto bom_found = (c0 == 0xEF) && (c1 == 0xBB) && (c2 == 0xBF);
        if( ! bom_found)
        {
            loc = first;
        }
    }

    context<TC> ctx(s);

    return parse_file(loc, ctx);
}